

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O2

void GetBinaryPathWithFileNameA(char *path,size_t buffer_size,char *filename)

{
  size_t __n;
  size_t sVar1;
  char local_368 [8];
  char modulename [260];
  char local_258 [8];
  char dir [256];
  char fullpath [260];
  char local_33 [8];
  char drive [3];
  
  PlatformAgnostic::SystemInfo::GetBinaryLocation(local_368,0x104);
  _splitpath_s(local_368,local_33,3,local_258,0x100,(char *)0x0,0,(char *)0x0,0);
  _makepath_s<260ul>((char (*) [260])(dir + 0xf8),local_33,local_258,filename,(char *)0x0);
  __n = strlen(dir + 0xf8);
  sVar1 = 0;
  if (__n < buffer_size) {
    memcpy(path,dir + 0xf8,__n);
    sVar1 = __n;
  }
  path[sVar1] = '\0';
  return;
}

Assistant:

void GetBinaryPathWithFileNameA(char *path, const size_t buffer_size, const char* filename)
{
    char fullpath[_MAX_PATH];
    char drive[_MAX_DRIVE];
    char dir[_MAX_DIR];

    char modulename[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(modulename, _MAX_PATH);
    _splitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _makepath_s(fullpath, drive, dir, filename, nullptr);

    size_t len = strlen(fullpath);
    if (len < buffer_size)
    {
        memcpy(path, fullpath, len * sizeof(char));
    }
    else
    {
        len = 0;
    }
    path[len] = char(0);
}